

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O1

void JsonLibTests_Output_Register(void)

{
  WjTestLib_NewGroup("Output");
  WjTestLib_AddTest(TestNumbers,"Numbers");
  WjTestLib_AddTest(TestBools,"Bools");
  WjTestLib_AddTest(TestStrings,"Strings");
  WjTestLib_AddTest(TestLists,"Lists");
  WjTestLib_AddTest(TestDictionaries,"Dictionaries");
  WjTestLib_AddTest(TestOutputFormats,"OutputFormats");
  return;
}

Assistant:

void
    JsonLibTests_Output_Register
    (
        void
    )
{
    WjTestLib_NewGroup( "Output" );
    WjTestLib_AddTest( TestNumbers, "Numbers" );
    WjTestLib_AddTest( TestBools, "Bools" );
    WjTestLib_AddTest( TestStrings, "Strings" );
    WjTestLib_AddTest( TestLists, "Lists" );
    WjTestLib_AddTest( TestDictionaries, "Dictionaries" );
    WjTestLib_AddTest( TestOutputFormats, "OutputFormats" );
}